

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

bool __thiscall
SQClass::NewSlot(SQClass *this,SQSharedState *ss,SQObjectPtr *key,SQObjectPtr *val,bool bstatic)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue *pSVar2;
  SQClass *pSVar3;
  bool bVar4;
  SQObjectType SVar5;
  SQObjectType SVar6;
  SQInteger SVar7;
  SQClosure *x;
  char cVar8;
  bool isconstructor;
  SQObjectPtr theval;
  SQObjectPtr temp;
  SQClassMember m;
  bool local_79;
  SQObjectPtr local_78;
  SQObjectPtr local_68;
  SQClassMember local_58;
  SQObjectPtr local_38;
  
  local_68.super_SQObject._type = OT_NULL;
  local_68.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar5 = (val->super_SQObject)._type;
  cVar8 = '\x01';
  if (((SVar5 == OT_CLOSURE) || (SVar5 == OT_NATIVECLOSURE)) ||
     (cVar8 = bstatic, (byte)(this->_locked ^ 1U | bstatic) == 1)) {
    bVar4 = SQTable::Get(this->_members,key,&local_68);
    if ((bVar4) && ((local_68.super_SQObject._unVal._0_4_ >> 0x19 & 1) != 0)) {
      bVar4 = true;
      SQObjectPtr::operator=
                ((SQObjectPtr *)
                 ((long)&(((this->_defaultvalues)._vals)->val).super_SQObject._type +
                 (ulong)((local_68.super_SQObject._unVal._0_4_ & 0xffffff) << 5)),val);
    }
    else {
      if (cVar8 == '\0') {
        local_58.val.super_SQObject._type = OT_NULL;
        local_58.val.super_SQObject._unVal.pTable = (SQTable *)0x0;
        local_58.attrs.super_SQObject._type = OT_NULL;
        local_58.attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
        SQObjectPtr::operator=(&local_58.val,val);
        local_78.super_SQObject._unVal.nInteger = (this->_defaultvalues)._size | 0x2000000;
        local_78.super_SQObject._type = OT_INTEGER;
        SQTable::NewSlot(this->_members,key,&local_78);
        SQObjectPtr::~SQObjectPtr(&local_78);
        sqvector<SQClassMember>::push_back(&this->_defaultvalues,&local_58);
        SQClassMember::~SQClassMember(&local_58);
      }
      else {
        SVar5 = (val->super_SQObject)._type;
        if ((SVar5 == OT_NATIVECLOSURE) || (SVar5 == OT_CLOSURE)) {
          SVar7 = SQSharedState::GetMetaMethodIdxByName(ss,key);
          if (SVar7 != -1) {
            bVar4 = true;
            SQObjectPtr::operator=(this->_metamethods + SVar7,val);
            goto LAB_0010a394;
          }
          SVar5 = (val->super_SQObject)._type;
        }
        local_78.super_SQObject._unVal = (SQObjectValue)(val->super_SQObject)._unVal.pTable;
        SVar6 = SVar5;
        if ((SVar5 >> 0x1b & 1) != 0) {
          pSVar1 = &((local_78.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
          SVar6 = (val->super_SQObject)._type;
        }
        local_78.super_SQObject._type = SVar5;
        if ((this->_base != (SQClass *)0x0) && (SVar6 == OT_CLOSURE)) {
          x = SQClosure::Clone((val->super_SQObject)._unVal.pClosure);
          SQObjectPtr::operator=(&local_78,x);
          pSVar3 = this->_base;
          (local_78.super_SQObject._unVal.pClosure)->_base = pSVar3;
          pSVar2 = (SQObjectValue *)&(pSVar3->super_SQCollectable).super_SQRefCounted._uiRef;
          pSVar2->pTable =
               (SQTable *)
               ((long)&(pSVar2->pTable->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                       _vptr_SQRefCounted + 1);
        }
        if (local_68.super_SQObject._type == OT_NULL) {
          SQVM::IsEqual(&ss->_constructoridx,key,&local_79);
          if (local_79 == true) {
            this->_constructoridx = (this->_methods)._size;
          }
          local_58.val.super_SQObject._type = OT_NULL;
          local_58.val.super_SQObject._unVal.pTable = (SQTable *)0x0;
          local_58.attrs.super_SQObject._type = OT_NULL;
          local_58.attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
          SQObjectPtr::operator=(&local_58.val,&local_78);
          local_38.super_SQObject._unVal.nInteger = (this->_methods)._size | 0x1000000;
          local_38.super_SQObject._type = OT_INTEGER;
          SQTable::NewSlot(this->_members,key,&local_38);
          SQObjectPtr::~SQObjectPtr(&local_38);
          sqvector<SQClassMember>::push_back(&this->_methods,&local_58);
          SQClassMember::~SQClassMember(&local_58);
        }
        else {
          SQObjectPtr::operator=
                    ((SQObjectPtr *)
                     ((long)&(((this->_methods)._vals)->val).super_SQObject._type +
                     (ulong)(((uint)local_68.super_SQObject._unVal.fFloat & 0xffffff) << 5)),
                     &local_78);
        }
        SQObjectPtr::~SQObjectPtr(&local_78);
      }
      bVar4 = true;
    }
  }
  else {
    bVar4 = false;
  }
LAB_0010a394:
  SQObjectPtr::~SQObjectPtr(&local_68);
  return bVar4;
}

Assistant:

bool SQClass::NewSlot(SQSharedState *ss,const SQObjectPtr &key,const SQObjectPtr &val,bool bstatic)
{
    SQObjectPtr temp;
    bool belongs_to_static_table = sq_type(val) == OT_CLOSURE || sq_type(val) == OT_NATIVECLOSURE || bstatic;
    if(_locked && !belongs_to_static_table)
        return false; //the class already has an instance so cannot be modified
    if(_members->Get(key,temp) && _isfield(temp)) //overrides the default value
    {
        _defaultvalues[_member_idx(temp)].val = val;
        return true;
    }
    if(belongs_to_static_table) {
        SQInteger mmidx;
        if((sq_type(val) == OT_CLOSURE || sq_type(val) == OT_NATIVECLOSURE) &&
            (mmidx = ss->GetMetaMethodIdxByName(key)) != -1) {
            _metamethods[mmidx] = val;
        }
        else {
            SQObjectPtr theval = val;
            if(_base && sq_type(val) == OT_CLOSURE) {
                theval = _closure(val)->Clone();
                _closure(theval)->_base = _base;
                __ObjAddRef(_base); //ref for the closure
            }
            if(sq_type(temp) == OT_NULL) {
                bool isconstructor;
                SQVM::IsEqual(ss->_constructoridx, key, isconstructor);
                if(isconstructor) {
                    _constructoridx = (SQInteger)_methods.size();
                }
                SQClassMember m;
                m.val = theval;
                _members->NewSlot(key,SQObjectPtr(_make_method_idx(_methods.size())));
                _methods.push_back(m);
            }
            else {
                _methods[_member_idx(temp)].val = theval;
            }
        }
        return true;
    }
    SQClassMember m;
    m.val = val;
    _members->NewSlot(key,SQObjectPtr(_make_field_idx(_defaultvalues.size())));
    _defaultvalues.push_back(m);
    return true;
}